

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 UVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  int *ip;
  int *ip_00;
  int *piVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  ulong local_c0;
  uint local_a8;
  int *local_a0;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  pBVar18 = (ms->window).base + (ms->window).dictLimit;
  uVar1 = *rep;
  uVar2 = rep[1];
  ip_00 = (int *)((ulong)(pBVar18 == (BYTE *)src) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar5 = (int)ip_00 - (int)pBVar18;
  local_a8 = uVar2;
  if (uVar5 < uVar2) {
    local_a8 = 0;
  }
  uVar17 = (ulong)uVar1;
  if (uVar5 < uVar1) {
    uVar17 = 0;
  }
  piVar10 = (int *)((long)src + (srcSize - 8));
  do {
    uVar16 = (uint)uVar17;
    lVar11 = -uVar17;
    while( true ) {
      if (piVar10 <= ip_00) {
        uVar9 = 0;
        if (uVar5 < uVar2) {
          uVar9 = uVar2;
        }
        if (uVar5 < uVar1) {
          uVar9 = uVar1;
        }
        if (uVar16 == 0) {
          uVar16 = uVar9;
        }
        if (local_a8 != 0) {
          uVar9 = local_a8;
        }
        *rep = uVar16;
        rep[1] = uVar9;
        return (long)pInLimit - (long)src;
      }
      if (uVar16 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        if (*(int *)((long)ip_00 + 1) == *(int *)((long)ip_00 + lVar11 + 1)) {
          sVar13 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar11 + 5),pInLimit)
          ;
          uVar12 = sVar13 + 4;
        }
      }
      iVar21 = (int)ip_00;
      if (cParams->searchLength - 6 < 2) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        uVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
        local_c0 = 99999999;
        uVar23 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((uVar7 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + uVar7, pBVar19[uVar23] == *(BYTE *)((long)ip_00 + uVar23) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar19,pInLimit), uVar23 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar7), uVar23 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar7 <= uVar14)) break;
          uVar7 = pUVar3[uVar7 & uVar6 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        uVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
        local_c0 = 99999999;
        uVar23 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if (((uVar7 <= uVar9) || (bVar24)) ||
             (((pBVar19 = pBVar4 + uVar7, pBVar19[uVar23] == *(BYTE *)((long)ip_00 + uVar23) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar19,pInLimit), uVar23 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar7), uVar23 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))) || (uVar7 <= uVar14)))) break;
          uVar7 = pUVar3[uVar7 & uVar6 - 1];
        }
      }
      else {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        uVar7 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
        local_c0 = 99999999;
        uVar23 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((uVar7 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + uVar7, pBVar19[uVar23] == *(BYTE *)((long)ip_00 + uVar23) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar19,pInLimit), uVar23 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar7), uVar23 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar7 <= uVar14)) break;
          uVar7 = pUVar3[uVar7 & uVar6 - 1];
        }
      }
      uVar15 = uVar12;
      if (uVar12 < uVar23) {
        uVar15 = uVar23;
      }
      if (3 < uVar15) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    if (uVar23 <= uVar12) {
      local_c0 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    if (uVar12 < uVar23) {
      ip = ip_00;
    }
LAB_0018bc7a:
    do {
      uVar12 = uVar15;
      uVar23 = local_c0;
      piVar20 = ip_00;
      local_a0 = ip;
      if (piVar10 <= piVar20) break;
      ip_00 = (int *)((long)piVar20 + 1);
      if (uVar23 == 0) {
        uVar23 = 0;
      }
      else if ((uVar16 != 0) && (*ip_00 == *(int *)((long)ip_00 + lVar11))) {
        sVar13 = ZSTD_count((BYTE *)((long)piVar20 + 5),(BYTE *)((long)piVar20 + lVar11 + 5),
                            pInLimit);
        if (sVar13 < 0xfffffffffffffffc) {
          uVar14 = (int)uVar23 + 1;
          uVar9 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar12 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
            uVar23 = 0;
            uVar12 = sVar13 + 4;
            local_a0 = ip_00;
          }
        }
      }
      iVar21 = (int)ip_00;
      if (cParams->searchLength - 6 < 2) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
        local_c0 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((UVar8 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + UVar8, pBVar19[uVar15] == *(BYTE *)((long)ip_00 + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar19,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (UVar8 <= uVar14)) break;
          UVar8 = pUVar3[UVar8 & uVar6 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
        local_c0 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((UVar8 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + UVar8, pBVar19[uVar15] == *(BYTE *)((long)ip_00 + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar19,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (UVar8 <= uVar14)) break;
          UVar8 = pUVar3[UVar8 & uVar6 - 1];
        }
      }
      else {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
        local_c0 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((UVar8 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + UVar8, pBVar19[uVar15] == *(BYTE *)((long)ip_00 + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar19,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (UVar8 <= uVar14)) break;
          UVar8 = pUVar3[UVar8 & uVar6 - 1];
        }
      }
      if (3 < uVar15) {
        uVar14 = (int)uVar23 + 1;
        uVar9 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar14 = (int)local_c0 + 1;
        iVar21 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar21 == 0; iVar21 = iVar21 + -1) {
          }
        }
        ip = ip_00;
        if ((int)((uVar9 ^ 0x1f) + (int)uVar12 * 4 + -0x1b) < (int)uVar15 * 4 - iVar21)
        goto LAB_0018bc7a;
      }
      if (piVar10 <= ip_00) break;
      ip = (int *)((long)piVar20 + 2);
      if (uVar23 == 0) {
        uVar23 = 0;
      }
      else if ((uVar16 != 0) && (*ip == *(int *)((long)ip + lVar11))) {
        sVar13 = ZSTD_count((BYTE *)((long)piVar20 + 6),(BYTE *)((long)piVar20 + lVar11 + 6),
                            pInLimit);
        if (sVar13 < 0xfffffffffffffffc) {
          uVar14 = (int)uVar23 + 1;
          uVar9 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar12 * 4 + -0x1e) < (int)(sVar13 + 4) * 4) {
            uVar23 = 0;
            uVar12 = sVar13 + 4;
            local_a0 = ip;
          }
        }
      }
      iVar21 = (int)ip;
      if (cParams->searchLength - 6 < 2) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        local_c0 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((UVar8 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + UVar8, pBVar19[uVar15] == *(BYTE *)((long)ip + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip,pBVar19,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar14)) break;
          UVar8 = pUVar3[UVar8 & uVar6 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        local_c0 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((UVar8 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + UVar8, pBVar19[uVar15] == *(BYTE *)((long)ip + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip,pBVar19,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar14)) break;
          UVar8 = pUVar3[UVar8 & uVar6 - 1];
        }
      }
      else {
        uVar6 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar22 = iVar21 - (int)pBVar4;
        uVar14 = uVar22 - uVar6;
        if (uVar22 < uVar6) {
          uVar14 = 0;
        }
        iVar21 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        local_c0 = 99999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if ((((UVar8 <= uVar9) || (bVar24)) ||
              ((pBVar19 = pBVar4 + UVar8, pBVar19[uVar15] == *(BYTE *)((long)ip + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip,pBVar19,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar14)) break;
          UVar8 = pUVar3[UVar8 & uVar6 - 1];
        }
      }
      if (uVar15 < 4) break;
      uVar14 = (int)uVar23 + 1;
      uVar9 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar14 = (int)local_c0 + 1;
      iVar21 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar21 == 0; iVar21 = iVar21 + -1) {
        }
      }
      ip_00 = ip;
    } while ((int)((uVar9 ^ 0x1f) + (int)uVar12 * 4 + -0x18) < (int)uVar15 * 4 - iVar21);
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      for (; ((src < local_a0 && (pBVar18 < (BYTE *)((long)local_a0 + (2 - uVar23)))) &&
             (*(BYTE *)((long)local_a0 + -1) == *(BYTE *)((long)local_a0 + (1 - uVar23))));
          local_a0 = (int *)((long)local_a0 + -1)) {
        uVar12 = uVar12 + 1;
      }
      uVar17 = (ulong)((int)uVar23 - 2);
      local_a8 = uVar16;
    }
    ZSTD_storeSeq(seqStore,(long)local_a0 - (long)src,src,(U32)uVar23,uVar12 - 3);
    for (ip_00 = (int *)((long)local_a0 + uVar12);
        ((src = ip_00, local_a8 != 0 && (ip_00 <= piVar10)) &&
        (*ip_00 == *(int *)((long)ip_00 - (ulong)local_a8)));
        ip_00 = (int *)((long)ip_00 + sVar13 + 4)) {
      sVar13 = ZSTD_count((BYTE *)(ip_00 + 1),(BYTE *)((long)ip_00 + (4 - (ulong)local_a8)),pInLimit
                         );
      ZSTD_storeSeq(seqStore,0,ip_00,0,sVar13 + 1);
      uVar12 = (ulong)local_a8;
      local_a8 = (uint)uVar17;
      uVar17 = uVar12;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 2);
}